

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::
     __move_merge_adaptive_backward<QList<std::pair<int,int>>::iterator,std::pair<int,int>*,QList<std::pair<int,int>>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (int *__first1,int *__last1,int *__first2,int *__last2,long __result)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  
  if (__first1 == __last1) {
    lVar4 = (long)__last2 - (long)__first2 >> 3;
    if (0 < lVar4) {
      lVar7 = 0;
      do {
        *(int *)(__result + -8 + lVar7 * 8) = __last2[lVar7 * 2 + -2];
        *(int *)(__result + -4 + lVar7 * 8) = __last2[lVar7 * 2 + -1];
        uVar1 = lVar4 + lVar7;
        lVar7 = lVar7 + -1;
      } while (1 < uVar1);
    }
  }
  else if (__first2 != __last2) {
    __last2 = __last2 + -2;
    do {
      lVar4 = __result;
      piVar6 = __last1 + -2;
      while( true ) {
        iVar2 = *__last2;
        iVar3 = *piVar6;
        if ((iVar2 < iVar3) || ((iVar2 <= iVar3 && (__last2[1] < __last1[-1])))) break;
        *(int *)(lVar4 + -8) = iVar2;
        *(int *)(lVar4 + -4) = __last2[1];
        if (__last2 == __first2) {
          return;
        }
        lVar4 = lVar4 + -8;
        __last2 = __last2 + -2;
      }
      *(int *)(lVar4 + -8) = iVar3;
      *(int *)(lVar4 + -4) = __last1[-1];
      __last1 = piVar6;
      __result = lVar4 + -8;
    } while (piVar6 != __first1);
    lVar7 = (long)__last2 + (8 - (long)__first2) >> 3;
    if (0 < lVar7) {
      lVar5 = 0;
      do {
        *(int *)(lVar4 + -0x10 + lVar5 * 8) = __last2[lVar5 * 2];
        *(int *)(lVar4 + -0xc + lVar5 * 8) = __last2[lVar5 * 2 + 1];
        uVar1 = lVar7 + lVar5;
        lVar5 = lVar5 + -1;
      } while (1 < uVar1);
    }
  }
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }